

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

Result * __thiscall
deqp::gles31::Functional::anon_unknown_1::TransformFeedbackHandler<tcu::Vector<float,_3>_>::
renderAndGetPrimitives
          (Result *__return_storage_ptr__,TransformFeedbackHandler<tcu::Vector<float,_3>_> *this,
          deUint32 programGL,deUint32 tfPrimTypeGL,int numBindings,VertexArrayBinding *bindings,
          int numVertices)

{
  glBindTransformFeedbackFunc p_Var1;
  glBindBufferFunc p_Var2;
  glBindBufferBaseFunc p_Var3;
  glBeginQueryFunc p_Var4;
  RenderContext *context;
  Functions *pFVar5;
  int iVar6;
  deUint32 dVar7;
  GLenum err;
  undefined4 extraout_var;
  int iVar8;
  PrimitiveList *__return_storage_ptr___00;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_70;
  deUint32 local_54;
  int numPrimsWritten;
  Functions *local_38;
  Functions *gl;
  VertexArrayBinding *bindings_local;
  deUint32 local_20;
  int numBindings_local;
  deUint32 tfPrimTypeGL_local;
  deUint32 programGL_local;
  TransformFeedbackHandler<tcu::Vector<float,_3>_> *this_local;
  
  gl = (Functions *)bindings;
  bindings_local._4_4_ = numBindings;
  local_20 = tfPrimTypeGL;
  numBindings_local = programGL;
  _tfPrimTypeGL_local = this;
  this_local = (TransformFeedbackHandler<tcu::Vector<float,_3>_> *)__return_storage_ptr__;
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_38 = (Functions *)CONCAT44(extraout_var,iVar6);
  p_Var1 = local_38->bindTransformFeedback;
  dVar7 = glu::ObjectWrapper::operator*(&(this->m_tf).super_ObjectWrapper);
  (*p_Var1)(0x8e22,dVar7);
  p_Var2 = local_38->bindBuffer;
  dVar7 = glu::ObjectWrapper::operator*(&(this->m_tfBuffer).super_ObjectWrapper);
  (*p_Var2)(0x8c8e,dVar7);
  p_Var3 = local_38->bindBufferBase;
  dVar7 = glu::ObjectWrapper::operator*(&(this->m_tfBuffer).super_ObjectWrapper);
  (*p_Var3)(0x8c8e,0,dVar7);
  p_Var4 = local_38->beginQuery;
  dVar7 = glu::ObjectWrapper::operator*(&(this->m_tfPrimQuery).super_ObjectWrapper);
  (*p_Var4)(0x8c88,dVar7);
  (*local_38->beginTransformFeedback)(local_20);
  iVar8 = numBindings_local;
  iVar6 = bindings_local._4_4_;
  pFVar5 = gl;
  context = this->m_renderCtx;
  __return_storage_ptr___00 = (PrimitiveList *)&stack0xffffffffffffffb0;
  glu::pr::Patches(__return_storage_ptr___00,numVertices);
  glu::draw(context,iVar8,iVar6,(VertexArrayBinding *)pFVar5,__return_storage_ptr___00,
            (DrawUtilCallback *)0x0);
  iVar8 = (int)__return_storage_ptr___00;
  err = (*local_38->getError)();
  glu::checkError(err,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0x15e);
  (*local_38->endTransformFeedback)();
  (*local_38->endQuery)(0x8c88);
  pFVar5 = local_38;
  dVar7 = glu::ObjectWrapper::operator*(&(this->m_tfPrimQuery).super_ObjectWrapper);
  dVar7 = getQueryResult(pFVar5,dVar7);
  pFVar5 = local_38;
  local_54 = dVar7;
  iVar6 = numVerticesPerPrimitive(local_20);
  readDataMapped<tcu::Vector<float,3>>
            (&local_70,(Functional *)pFVar5,(Functions *)0x8c8e,dVar7 * iVar6,iVar8);
  Result::Result(__return_storage_ptr__,dVar7,&local_70);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector(&local_70);
  return __return_storage_ptr__;
}

Assistant:

typename TransformFeedbackHandler<AttribType>::Result TransformFeedbackHandler<AttribType>::renderAndGetPrimitives (deUint32 programGL, deUint32 tfPrimTypeGL, int numBindings, const glu::VertexArrayBinding* bindings, int numVertices) const
{
	DE_ASSERT(tfPrimTypeGL == GL_POINTS || tfPrimTypeGL == GL_LINES || tfPrimTypeGL == GL_TRIANGLES);

	const glw::Functions& gl = m_renderCtx.getFunctions();

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, *m_tf);
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, *m_tfBuffer);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, *m_tfBuffer);

	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, *m_tfPrimQuery);
	gl.beginTransformFeedback(tfPrimTypeGL);

	glu::draw(m_renderCtx, programGL, numBindings, bindings, glu::pr::Patches(numVertices));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

	gl.endTransformFeedback();
	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);

	{
		const int numPrimsWritten = (int)getQueryResult(gl, *m_tfPrimQuery);
		return Result(numPrimsWritten, readDataMapped<AttribType>(gl, GL_TRANSFORM_FEEDBACK_BUFFER, numPrimsWritten * numVerticesPerPrimitive(tfPrimTypeGL)));
	}
}